

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  ModportClockingPortSyntax *syntax_00;
  ModportNamedPortSyntax *syntax_01;
  SyntaxNode *syntax_02;
  ModportExplicitPortSyntax *syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_05;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_06;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_07;
  ModportDeclarationSyntax *pMVar4;
  ArgumentDirection direction;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  ModportSymbol *this;
  MethodPrototypeSymbol *this_00;
  ModportClockingSymbol *this_01;
  ModportPortSymbol *this_02;
  undefined1 *puVar6;
  ModportSubroutinePortListSyntax *portList;
  ulong uVar7;
  long lVar8;
  ModportSymbol *modport;
  string_view local_88;
  ulong local_78;
  byte *local_70;
  Compilation *local_68;
  ModportDeclarationSyntax *local_60;
  SmallVectorBase<const_slang::ast::ModportSymbol_*> *local_58;
  ulong local_50;
  SyntaxNode *local_48;
  undefined1 *local_40;
  SourceLocation local_38;
  
  local_78 = (syntax->items).elements._M_extent._M_extent_value + 1;
  if (1 < local_78) {
    local_68 = ((context->scope).ptr)->compilation;
    local_78 = local_78 >> 1;
    local_50 = 0;
    local_60 = syntax;
    local_58 = results;
    do {
      pMVar4 = local_60;
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((local_60->items).elements._M_ptr + local_50 * 2));
      pSVar3 = *ppSVar5;
      local_88 = parsing::Token::valueText((Token *)(pSVar3 + 1));
      local_38 = parsing::Token::location((Token *)(pSVar3 + 1));
      this = BumpAllocator::
             emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&local_68->super_BumpAllocator,local_68,&local_88,&local_38);
      local_88._M_len = (size_t)this;
      (this->super_Symbol).originatingSyntax = pSVar3;
      syntax_04._M_ptr =
           (pMVar4->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_04._M_extent._M_extent_value =
           (pMVar4->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&this->super_Symbol,(context->scope).ptr,syntax_04);
      SmallVectorBase<slang::ast::ModportSymbol_const*>::
      emplace_back<slang::ast::ModportSymbol_const*const&>
                ((SmallVectorBase<slang::ast::ModportSymbol_const*> *)local_58,
                 (ModportSymbol **)&local_88);
      local_48 = pSVar3[1].previewNode;
      local_70 = (byte *)((long)&(local_48[3].previewNode)->kind + 1);
      if ((byte *)0x1 < local_70) {
        local_70 = (byte *)((ulong)local_70 >> 1);
        puVar6 = (undefined1 *)0x0;
        do {
          local_40 = puVar6;
          ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               (local_48[3].parent + (long)puVar6 * 2));
          syntax_00 = (ModportClockingPortSyntax *)*ppSVar5;
          SVar2 = (syntax_00->super_MemberSyntax).super_SyntaxNode.kind;
          if (SVar2 == ModportClockingPort) {
            this_01 = ModportClockingSymbol::fromSyntax(context,syntax_00);
            syntax_06._M_ptr =
                 (syntax_00->super_MemberSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
            ;
            syntax_06._M_extent._M_extent_value =
                 (syntax_00->super_MemberSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            Symbol::setAttributes
                      (&this_01->super_Symbol,(Scope *)(local_88._M_len + 0x40),syntax_06);
            Scope::insertMember((Scope *)(local_88._M_len + 0x40),&this_01->super_Symbol,
                                *(Symbol **)(local_88._M_len + 0x60),false,true);
          }
          else if (SVar2 == ModportSubroutinePortList) {
            TVar1 = (syntax_00->clocking).kind;
            if (TVar1 == ExportKeyword) {
              *(undefined1 *)(local_88._M_len + 0x78) = 1;
            }
            uVar7 = *(long *)&syntax_00[1].super_MemberSyntax.attributes.super_SyntaxListBase.
                              super_SyntaxNode + 1;
            if (1 < uVar7) {
              uVar7 = uVar7 >> 1;
              lVar8 = 0;
              do {
                ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                    ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      *)((long)syntax_00[1].super_MemberSyntax.attributes.
                                               super_SyntaxListBase._vptr_SyntaxListBase + lVar8));
                syntax_01 = (ModportNamedPortSyntax *)*ppSVar5;
                syntax_02 = (syntax_01->super_ModportPortSyntax).super_SyntaxNode.previewNode;
                if (syntax_02 != (SyntaxNode *)0x0) {
                  Scope::addMembers((Scope *)(local_88._M_len + 0x40),syntax_02);
                }
                if ((syntax_01->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort)
                {
                  this_00 = MethodPrototypeSymbol::fromSyntax
                                      (context,syntax_01,TVar1 == ExportKeyword);
                }
                else {
                  this_00 = MethodPrototypeSymbol::fromSyntax
                                      ((context->scope).ptr,(ModportSubroutinePortSyntax *)syntax_01
                                       ,TVar1 == ExportKeyword);
                }
                syntax_05._M_ptr =
                     (syntax_00->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_ptr;
                syntax_05._M_extent._M_extent_value =
                     (syntax_00->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                Symbol::setAttributes
                          (&this_00->super_Symbol,(Scope *)(local_88._M_len + 0x40),syntax_05);
                Scope::insertMember((Scope *)(local_88._M_len + 0x40),&this_00->super_Symbol,
                                    *(Symbol **)(local_88._M_len + 0x60),false,true);
                lVar8 = lVar8 + 0x30;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
          }
          else {
            direction = SemanticFacts::getDirection((syntax_00->clocking).kind);
            uVar7 = *(long *)&syntax_00[1].super_MemberSyntax.attributes.super_SyntaxListBase.
                              super_SyntaxNode + 1;
            if (1 < uVar7) {
              uVar7 = uVar7 >> 1;
              lVar8 = 0;
              do {
                ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                    ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      *)((long)syntax_00[1].super_MemberSyntax.attributes.
                                               super_SyntaxListBase._vptr_SyntaxListBase + lVar8));
                syntax_03 = (ModportExplicitPortSyntax *)*ppSVar5;
                if ((syntax_03->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort)
                {
                  this_02 = ModportPortSymbol::fromSyntax
                                      (context,direction,(ModportNamedPortSyntax *)syntax_03);
                }
                else {
                  this_02 = ModportPortSymbol::fromSyntax(context,direction,syntax_03);
                }
                syntax_07._M_ptr =
                     (syntax_00->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_ptr;
                syntax_07._M_extent._M_extent_value =
                     (syntax_00->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
                Symbol::setAttributes((Symbol *)this_02,(Scope *)(local_88._M_len + 0x40),syntax_07)
                ;
                Scope::insertMember((Scope *)(local_88._M_len + 0x40),(Symbol *)this_02,
                                    *(Symbol **)(local_88._M_len + 0x60),false,true);
                lVar8 = lVar8 + 0x30;
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
            }
          }
          puVar6 = local_40 + 1;
        } while (puVar6 != local_70);
      }
      local_50 = local_50 + 1;
    } while (local_50 != local_78);
  }
  return;
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        if (subPort->previewNode)
                            modport->addMembers(*subPort->previewNode);

                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    SLANG_UNREACHABLE;
                }
            }
        }
    }
}